

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 4.hpp
# Opt level: O2

void __thiscall njoy::ENDFtk::section::Type<4>::Type(Type<4> *this,Type<4> *param_1)

{
  double dVar1;
  undefined4 uVar2;
  
  uVar2 = *(undefined4 *)&(param_1->super_Base).field_0x14;
  (this->super_Base).MT_ = (param_1->super_Base).MT_;
  *(undefined4 *)&(this->super_Base).field_0x14 = uVar2;
  uVar2 = *(undefined4 *)
           &(param_1->super_Base).super_BaseWithoutMT<njoy::ENDFtk::section::Base>.field_0x4;
  dVar1 = (param_1->super_Base).super_BaseWithoutMT<njoy::ENDFtk::section::Base>.atomicWeightRatio_;
  (this->super_Base).super_BaseWithoutMT<njoy::ENDFtk::section::Base>.ZA_ =
       (param_1->super_Base).super_BaseWithoutMT<njoy::ENDFtk::section::Base>.ZA_;
  *(undefined4 *)&(this->super_Base).super_BaseWithoutMT<njoy::ENDFtk::section::Base>.field_0x4 =
       uVar2;
  (this->super_Base).super_BaseWithoutMT<njoy::ENDFtk::section::Base>.atomicWeightRatio_ = dVar1;
  *(undefined4 *)&(this->super_Base).field_0x14 = *(undefined4 *)&(param_1->super_Base).field_0x14;
  std::__detail::__variant::
  _Move_ctor_base<false,_njoy::ENDFtk::section::Type<4>::Isotropic,_njoy::ENDFtk::section::Type<4>::LegendreDistributions,_njoy::ENDFtk::section::Type<4>::TabulatedDistributions,_njoy::ENDFtk::section::Type<4>::MixedDistributions>
  ::_Move_ctor_base((_Move_ctor_base<false,_njoy::ENDFtk::section::Type<4>::Isotropic,_njoy::ENDFtk::section::Type<4>::LegendreDistributions,_njoy::ENDFtk::section::Type<4>::TabulatedDistributions,_njoy::ENDFtk::section::Type<4>::MixedDistributions>
                     *)&this->distributions_,
                    (_Move_ctor_base<false,_njoy::ENDFtk::section::Type<4>::Isotropic,_njoy::ENDFtk::section::Type<4>::LegendreDistributions,_njoy::ENDFtk::section::Type<4>::TabulatedDistributions,_njoy::ENDFtk::section::Type<4>::MixedDistributions>
                     *)&param_1->distributions_);
  return;
}

Assistant:

class ENDFTK_PYTHON_EXPORT Type< 4 > : protected Base {

  protected:

    #include "ENDFtk/section/4/AngularDistributions.hpp"

  public:

    #include "ENDFtk/section/4/LegendreCoefficients.hpp"
    #include "ENDFtk/section/4/TabulatedDistribution.hpp"

    #include "ENDFtk/section/4/Isotropic.hpp"                    // LTT=0, LI=1
    #include "ENDFtk/section/4/LegendreDistributions.hpp"        // LTT=1, LI=0
    #include "ENDFtk/section/4/TabulatedDistributions.hpp"       // LTT=2, LI=0
    #include "ENDFtk/section/4/MixedDistributions.hpp"           // LTT=3, LI=0

    using LTT0 = Isotropic;
    using LTT1 = LegendreDistributions;
    using LTT2 = TabulatedDistributions;
    using LTT3 = MixedDistributions;

    /** @typedef Distributions
     *  @brief The secondary particle angular distribution of MF4
     *
     *  This distribution class is set up as a variant.
     */
    using Distributions =
              std::variant< Isotropic,                           // LTT=0, LI=1
                            LegendreDistributions,               // LTT=1, LI=0
                            TabulatedDistributions,              // LTT=2, LI=0
                            MixedDistributions >;                // LTT=3, LI=0

    using Variant =
      std::variant< std::reference_wrapper< const LegendreCoefficients >,
                    std::reference_wrapper< const TabulatedDistribution > >;

  private:

    /* type aliases */
    template < typename Element >
    using RandomAccessAnyView = ranges::any_view< Element, ranges::category::random_access >;
    using DoubleRange = RandomAccessAnyView< double >;
    using LongRange = RandomAccessAnyView< long >;
    using VariantRange = RandomAccessAnyView< Variant >;

    /* fields */
    int lct_;
    Distributions distributions_;

    /* auxiliary functions */
    #include "ENDFtk/section/4/src/readDistributions.hpp"

  public:

    /* constructor */
    #include "ENDFtk/section/4/src/ctor.hpp"

    /* get methods */

    /**
     *  @brief Return the reference frame
     */
    int LCT() const { return this->lct_; }

    /**
     *  @brief Return the reference frame
     */
    int referenceFrame() const { return this->LCT(); }

    /**
     *  @brief Return the distribution law
     */
    int LTT() const { return this->distributions_.index(); }

    /**
     *  @brief Return the distribution law
     */
    int LAW() const { return this->LTT(); }

    /**
     *  @brief Return the isotropic angular distribution flag
     */
    bool LI() const { return this->LTT() == 0; }

    /**
     *  @brief Return the isotropic angular distribution flag
     */
    bool isotropicDistributions() const { return this->LI(); }

    /**
     *  @brief Return the partial distributions defined in this section
     */
    const Distributions& distributions() const { return this->distributions_; }

    /**
     *  @brief Return the number of interpolation regions
     */
    long NR() const {

      return std::visit(
               tools::overload{
                   [] ( const Isotropic& ) -> int
                      { return 0; },
                   [] ( const auto& distributions ) -> int
                      { return distributions.NR(); } },
               this->distributions_ );
    }

    /**
     *  @brief Return the number of interpolation regions
     */
    auto numberInterpolationRegions() const { return this->NR(); }

    /**
     *  @brief Return the number of incident energy points
     */
    auto NE() const {

      return std::visit(
               tools::overload{
                   [] ( const Isotropic& ) -> int
                      { return 0; },
                   [] ( const auto& distributions ) -> int
                      { return distributions.NE(); } },
               this->distributions_ );
    }

    /**
     *  @brief Return the number of incident energy points
     */
    auto numberIncidentEnergies() const { return this->NE(); }

    /**
     *  @brief Return the interpolants of the interpolation regions
     */
    auto INT() const {

      return std::visit(
               tools::overload{
                   [] ( const Isotropic& ) -> LongRange
                      { return ranges::cpp20::views::empty< long >; },
                   [] ( const auto& distributions ) -> LongRange
                      { return distributions.INT(); } },
               this->distributions_ );
    }

    /**
     *  @brief Return the interpolants of the interpolation regions
     */
    auto interpolants() const { return this->INT(); }

    /**
     *  @brief Return the boundaries of the interpolation regions
     *
     *         The intersection point is considered as a jump in the incident
     *         energy.
     */
    auto NBT() const {

      return std::visit(
               tools::overload{
                   [] ( const Isotropic& ) -> LongRange
                      { return ranges::cpp20::views::empty< long >; },
                   [] ( const auto& distributions ) -> LongRange
                      { return distributions.NBT(); } },
               this->distributions_ );
    }

    /**
     *  @brief Return the boundaries of the interpolation regions
     *
     *         The intersection point is considered as a jump in the incident
     *         energy.
     */
    auto boundaries() const { return this->NBT(); }

    /**
     *  @brief Return the incident energy values
     */
    auto incidentEnergies() const {

      return std::visit(
               tools::overload{
                   [] ( const Isotropic& ) -> DoubleRange
                      { return ranges::cpp20::views::empty< double >; },
                   [] ( const auto& distributions ) -> DoubleRange
                      { return distributions.incidentEnergies(); } },
               this->distributions_ );
    }

    #include "ENDFtk/section/4/src/angularDistributions.hpp"

    #include "ENDFtk/section/4/src/NC.hpp"
    #include "ENDFtk/section/4/src/print.hpp"

    using Base::MT;
    using Base::sectionNumber;
    using Base::ZA;
    using Base::targetIdentifier;
    using Base::atomicWeightRatio;
    using Base::AWR;
  }